

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O0

cycle_formatter_yyyymmddhh * __thiscall
cornelich::cycle_formatter_yyyymmddhh::date_from_cycle_impl_abi_cxx11_
          (cycle_formatter_yyyymmddhh *this,int64_t cycle)

{
  day_point *dp;
  precision *this_00;
  type this_01;
  long in_RDX;
  duration<long,_std::ratio<1L,_1000000000L>_> d;
  duration<long,_std::ratio<3600L,_1L>_> local_458;
  rep_conflict local_450;
  day local_441;
  uint local_440;
  month local_439;
  uint local_438;
  year local_432;
  int local_430;
  char local_429;
  int local_428;
  type local_424;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_418;
  char local_401;
  int local_400;
  type local_3fc;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  local_3f0;
  char local_3d9;
  int local_3d8;
  type local_3d4;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_3c8;
  char local_3b1;
  int local_3b0;
  type local_3ac;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  local_3a0;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_390;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_380;
  expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,_boost::proto::argsns_::list2<const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>_&,_const_boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>_&>,_2L>
  local_370 [2];
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sink;
  undefined1 local_338 [8];
  time_of_day<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> tod;
  year_month_day ymd;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<int,_std::ratio<86400L,_1L>_>_>
  daypoint;
  duration<long,std::ratio<1l,1000000000l>> local_300 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_2f8;
  time_point ts;
  time_t s;
  int64_t cycle_local;
  cycle_formatter_yyyymmddhh *this_local;
  string *result;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  that;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_5;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_3;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::uint_>_&>,_2L>
  that_1;
  undefined1 local_1d1;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 local_1b1;
  undefined1 *local_1b0;
  undefined1 local_1a1;
  undefined1 *local_1a0;
  undefined1 local_191;
  undefined1 *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  expr<boost::proto::tagns_::tag::subscript,_boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,_boost::fusion::vector<int,_char>_>_>,_0L>_&,_const_boost::spirit::terminal<boost::spirit::tag::int_>_&>,_2L>
  *peStack_150;
  expr_type that_2;
  expr_type that_4;
  expr_type that_6;
  
  ts.__d.__r = (duration)((in_RDX * *(int *)(cycle + 8)) / 1000);
  std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>
            ((duration<long,std::ratio<1l,1l>> *)&ymd,(long *)&ts);
  std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
            (local_300,(duration<long,_std::ratio<1L,_1L>_> *)&ymd);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&local_2f8,(duration *)local_300);
  tod.
  super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
  .sub_s_.__r._4_4_ =
       date::
       floor<std::chrono::duration<int,std::ratio<86400l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                 (&local_2f8);
  dp = (day_point *)
       ((long)&tod.
               super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
               .sub_s_.__r + 4);
  date::year_month_day::year_month_day
            ((year_month_day *)
             &tod.
              super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
              .sub_s_,dp);
  this_01 = std::chrono::operator-(&local_2f8,dp);
  date::make_time<long,std::ratio<1l,1000000000l>,void>
            ((time_of_day<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)local_338,
             (date *)this_01.__r,d);
  sink.container._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::back_insert_iterator
            (&local_350,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_3b0 = 4;
  local_3b1 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_3ac,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_3b0,&local_3b1,(is_false)0x0);
  local_3a0.child0 = &local_3ac;
  local_1d0 = &boost::spirit::int_;
  local_1c0 = &local_1d1;
  local_1c8 = &boost::spirit::int_;
  local_3a0.child1 = (proto_child1)&boost::spirit::int_;
  local_3d8 = 2;
  local_3d9 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_3d4,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_3d8,&local_3d9,(is_false)0x0);
  local_3c8.child0 = &local_3d4;
  local_1b0 = &boost::spirit::uint_;
  local_160 = &local_1b1;
  local_168 = &boost::spirit::uint_;
  local_3c8.child1 = (proto_child1)&boost::spirit::uint_;
  local_390.child0 = &local_3a0;
  local_390.child1 = (proto_child1)&local_3c8;
  local_400 = 2;
  local_401 = '0';
  peStack_150 = local_390.child0;
  that_2.child0 = (proto_child0)local_390.child1;
  that_2.child1 = local_390.child1;
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_3fc,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_400,&local_401,(is_false)0x0);
  local_3f0.child0 = &local_3fc;
  local_1a0 = &boost::spirit::uint_;
  local_170 = &local_1a1;
  local_178 = &boost::spirit::uint_;
  local_3f0.child1 = (proto_child1)&boost::spirit::uint_;
  local_380.child0 = &local_390;
  local_380.child1 = &local_3f0;
  local_428 = 2;
  local_429 = '0';
  boost::spirit::terminal<boost::spirit::tag::right_align>::operator()
            (&local_424,(terminal<boost::spirit::tag::right_align> *)&boost::spirit::right_align,
             &local_428,&local_429,(is_false)0x0);
  local_418.child0 = &local_424;
  local_190 = &boost::spirit::uint_;
  local_180 = &local_191;
  local_188 = &boost::spirit::uint_;
  local_418.child1 = (proto_child1)&boost::spirit::uint_;
  local_370[0].child0 = &local_380;
  local_370[0].child1 = &local_418;
  this_00 = &tod.
             super_time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
             .sub_s_;
  local_432 = date::year_month_day::year((year_month_day *)this_00);
  local_430 = date::year::operator_cast_to_int(&local_432);
  local_439 = date::year_month_day::month((year_month_day *)this_00);
  local_438 = date::month::operator_cast_to_unsigned_int(&local_439);
  local_441 = date::year_month_day::day((year_month_day *)this_00);
  local_440 = date::day::operator_cast_to_unsigned_int(&local_441);
  local_458.__r =
       (rep_conflict)
       date::detail::
       time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
       ::hours((time_of_day_storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_(date::detail::classify)4>
                *)local_338);
  local_450 = std::chrono::duration<long,_std::ratio<3600L,_1L>_>::count(&local_458);
  boost::spirit::karma::
  generate<std::back_insert_iterator<std::__cxx11::string>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_left,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::right_align,boost::fusion::vector<int,char>>>,0l>&,boost::spirit::terminal<boost::spirit::tag::uint_>const&>,2l>const&>,2l>,int,unsigned_int,unsigned_int,long>
            (&local_350,local_370,&local_430,&local_438,&local_440,&local_450);
  return this;
}

Assistant:

std::string cycle_formatter_yyyymmddhh::date_from_cycle_impl(std::int64_t cycle) const
{
    const auto s = static_cast<std::time_t>(cycle * m_cycle_length / 1000);
    auto ts = system_clock::time_point(seconds(s));
    auto daypoint = floor<days>(ts);
    auto ymd = year_month_day(daypoint);
    auto tod = make_time(ts - daypoint);

    using namespace boost::spirit;

    std::string result;
    std::back_insert_iterator<std::string> sink(result);
    karma::generate(sink,
                    karma::right_align(4, '0')[karma::int_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_] << karma::right_align(2, '0')[karma::uint_],
            int(ymd.year()), unsigned(ymd.month()), unsigned(ymd.day()), tod.hours().count());
    return result;
}